

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isNearestMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  CompareMode compareMode;
  bool isFixedPointDepth_00;
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int iVar2;
  int iVar3;
  TextureFormat *format;
  float fVar4;
  Vector<float,_2> local_b8;
  float local_b0;
  int local_ac;
  float depth1;
  int i1;
  int j1;
  float depth0;
  int i0;
  int j0;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int h1;
  int h0;
  int w1;
  int w0;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  int coordZ_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  format = ConstPixelBufferAccess::getFormat(level0);
  isFixedPointDepth_00 = isFixedPointDepthTextureFormat(format);
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  bVar1 = sampler->normalizedCoords;
  fVar4 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar4,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar4 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar4,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar4 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar4,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar4 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_02,fVar4,iVar2,iVar3);
  fVar4 = Vector<float,_2>::x(&uBounds1);
  minI1 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::y(&uBounds1);
  maxI1 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::x(&vBounds0);
  minJ0 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::y(&vBounds0);
  maxJ0 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::x(&vBounds1);
  minJ1 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::y(&vBounds1);
  maxJ1 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  j0 = ::deFloorFloatToInt32(fVar4);
  fVar4 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  i0 = ::deFloorFloatToInt32(fVar4);
  depth0 = (float)minJ1;
  do {
    if (maxJ1 < (int)depth0) {
      return false;
    }
    for (j1 = minI1; j1 <= maxI1; j1 = j1 + 1) {
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,j1,dim);
      iVar3 = TexVerifierUtil::wrap(sampler->wrapT,(int)depth0,dim_01);
      i1 = (int)lookupDepth(level0,sampler,iVar2,iVar3,coordZ);
      for (depth1 = (float)j0; (int)depth1 <= i0; depth1 = (float)((int)depth1 + 1)) {
        for (local_ac = minJ0; local_ac <= maxJ0; local_ac = local_ac + 1) {
          iVar2 = TexVerifierUtil::wrap(sampler->wrapS,local_ac,dim_00);
          iVar3 = TexVerifierUtil::wrap(sampler->wrapT,(int)depth1,dim_02);
          local_b0 = lookupDepth(level1,sampler,iVar2,iVar3,coordZ);
          compareMode = sampler->compare;
          Vector<float,_2>::Vector(&local_b8,(float)i1,local_b0);
          bVar1 = isLinearCompareValid
                            (compareMode,prec,&local_b8,fBounds,cmpReference,result,
                             isFixedPointDepth_00);
          if (bVar1) {
            return true;
          }
        }
      }
    }
    depth0 = (float)((int)depth0 + 1);
  } while( true );
}

Assistant:

static bool isNearestMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													 const ConstPixelBufferAccess&	level1,
													 const Sampler&					sampler,
													 const TexComparePrecision&		prec,
													 const Vec2&					coord,
													 const int						coordZ,
													 const Vec2&					fBounds,
													 const float					cmpReference,
													 const float					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x());
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y());
	const int	minI1				= deFloorFloatToInt32(uBounds1.x());
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y());
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x());
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y());
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x());
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	depth0	= lookupDepth(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	depth1	= lookupDepth(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearCompareValid(sampler.compare, prec, Vec2(depth0, depth1), fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}